

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int i;
  _Bool _Var1;
  shared_container_t *container;
  container_t *pcVar2;
  container_t *c1_1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  int iStack_30;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  int intersection_size;
  int length2;
  int length1;
  uint8_t result_type;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  _length1 = &x2->high_low_container;
  x2_local = x1;
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3ec9,
                  "void roaring_bitmap_andnot_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  length2._3_1_ = '\0';
  intersection_size = (x1->high_low_container).size;
  pos1 = (x2->high_low_container).size;
  pos2 = 0;
  if (pos1 != 0) {
    if (intersection_size == 0) {
      roaring_bitmap_clear(x1);
    }
    else {
      _s1 = 0;
      iStack_30 = 0;
      c1._4_2_ = ra_get_key_at_index(&x1->high_low_container,0);
      c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_30);
      while( true ) {
        while (c1._4_2_ != c1._2_2_) {
          if (c1._4_2_ < c1._2_2_) {
            if (_s1 != pos2) {
              pcVar2 = ra_get_container_at_index
                                 (&x2_local->high_low_container,(uint16_t)_s1,
                                  (uint8_t *)((long)&c1 + 7));
              ra_replace_key_and_container_at_index
                        (&x2_local->high_low_container,pos2,c1._4_2_,pcVar2,c1._7_1_);
            }
            pos2 = pos2 + 1;
            _s1 = _s1 + 1;
            if (_s1 == intersection_size) goto LAB_0014542c;
            c1._4_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
          }
          else {
            iStack_30 = ra_advance_until(_length1,c1._4_2_,iStack_30);
            if (iStack_30 == pos1) goto LAB_0014542c;
            c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_30);
          }
        }
        container = (shared_container_t *)
                    ra_get_container_at_index
                              (&x2_local->high_low_container,(uint16_t)_s1,
                               (uint8_t *)((long)&c1 + 7));
        pcVar2 = ra_get_container_at_index(_length1,(uint16_t)iStack_30,(uint8_t *)((long)&c1 + 6));
        if (c1._7_1_ == '\x04') {
          c1_1 = container_andnot(container,'\x04',pcVar2,c1._6_1_,(uint8_t *)((long)&length2 + 3));
          shared_container_free(container);
        }
        else {
          c1_1 = container_iandnot(container,c1._7_1_,pcVar2,c1._6_1_,
                                   (uint8_t *)((long)&length2 + 3));
        }
        _Var1 = container_nonzero_cardinality(c1_1,length2._3_1_);
        i = pos2;
        if (_Var1) {
          pos2 = pos2 + 1;
          ra_replace_key_and_container_at_index
                    (&x2_local->high_low_container,i,c1._4_2_,c1_1,length2._3_1_);
        }
        else {
          container_free(c1_1,length2._3_1_);
        }
        _s1 = _s1 + 1;
        iStack_30 = iStack_30 + 1;
        if ((_s1 == intersection_size) || (iStack_30 == pos1)) break;
        c1._4_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
        c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_30);
      }
LAB_0014542c:
      if ((int)_s1 < intersection_size) {
        if (pos2 < (int)_s1) {
          ra_copy_range(&x2_local->high_low_container,_s1,intersection_size,pos2);
        }
        pos2 = (intersection_size - _s1) + pos2;
      }
      ra_downsize(&x2_local->high_low_container,pos2);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                                        &x1->high_low_container, pos1, &type1);

                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c1,
                                                      type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}